

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shell.cpp
# Opt level: O1

bool anon_unknown.dwarf_69c8::prefixed(string_view command,string_view prefix,string_view *suffix)

{
  int iVar1;
  ulong __n;
  bool bVar2;
  string_view sVar3;
  string_view local_28;
  
  __n = prefix._len;
  local_28._len = command._len;
  local_28._ptr = command._ptr;
  if (local_28._len < __n) {
    bVar2 = false;
  }
  else if (__n == 0) {
    bVar2 = true;
  }
  else {
    iVar1 = bcmp(local_28._ptr,prefix._ptr,__n);
    bVar2 = iVar1 == 0;
  }
  if (bVar2 != false) {
    sVar3 = mserialize::string_view::substr(&local_28,__n,0xffffffffffffffff);
    *suffix = sVar3;
  }
  return bVar2;
}

Assistant:

bool prefixed(mserialize::string_view command, mserialize::string_view prefix, mserialize::string_view& suffix)
{
  if (! command.starts_with(prefix)) { return false; }

  suffix = command.substr(prefix.size());
  return true;
}